

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,DCSFileNameHeader *h)

{
  value_t t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  json_value local_18;
  
  local_18.object = (object_t *)0x0;
  pbVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::create<std::__cxx11::string,std::__cxx11::string_const&>(&h->fileName);
  t = j->m_type;
  j->m_type = string;
  local_18 = j->m_value;
  (j->m_value).object = (object_t *)pbVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_18.boolean,t);
  return;
}

Assistant:

void to_json(json& j, const DCSFileNameHeader& h) {
  j = h.fileName;
}